

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void do_test_record_receipt(size_t epoch)

{
  int iVar1;
  st_quicly_pn_space_t *psVar2;
  long lVar3;
  uint64_t in_RDI;
  int64_t send_ack_at;
  int64_t now;
  uint64_t pn;
  st_quicly_pn_space_t *space;
  undefined8 in_stack_ffffffffffffffe0;
  int64_t *piVar4;
  size_t in_stack_ffffffffffffffe8;
  int is_ack_only;
  
  psVar2 = alloc_pn_space(in_stack_ffffffffffffffe8,
                          (uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  piVar4 = (int64_t *)0x3039;
  iVar1 = (int)((ulong)psVar2 >> 0x20);
  if (in_RDI == 3) {
    lVar3 = 1;
    iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,3,iVar1,1,(int64_t *)0x3039);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ba);
    _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffe6),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bb);
    piVar4 = (int64_t *)((long)piVar4 + 1);
    lVar3 = lVar3 + 1;
    iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                           lVar3,piVar4);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bd);
    _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1be);
  }
  else {
    lVar3 = 1;
    iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,iVar1,1,(int64_t *)0x3039);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1c2);
    _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1c3);
  }
  piVar4 = (int64_t *)((long)piVar4 + 1);
  psVar2->unacked_count = 0;
  lVar3 = lVar3 + 1;
  iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                         lVar3,piVar4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cc)
  ;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cd)
  ;
  piVar4 = (int64_t *)((long)piVar4 + 1);
  lVar3 = lVar3 + 1;
  iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                         lVar3,piVar4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cf)
  ;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d0)
  ;
  piVar4 = (int64_t *)((long)piVar4 + 1);
  lVar3 = lVar3 + 2;
  iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                         lVar3,piVar4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d3)
  ;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d4)
  ;
  piVar4 = (int64_t *)((long)piVar4 + 1);
  lVar3 = lVar3 + 1;
  iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                         lVar3,piVar4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d6)
  ;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d7)
  ;
  piVar4 = (int64_t *)((long)piVar4 + 1);
  lVar3 = lVar3 + 2;
  iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,(int)((ulong)psVar2 >> 0x20),
                         lVar3,piVar4);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dc)
  ;
  _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dd)
  ;
  piVar4 = (int64_t *)((long)piVar4 + 1);
  psVar2->unacked_count = 0;
  if (in_RDI == 3) {
    psVar2->ignore_order = '\x01';
    lVar3 = lVar3 + 2;
    iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,3,(int)((ulong)psVar2 >> 0x20),lVar3,
                           piVar4);
    is_ack_only = (int)((ulong)psVar2 >> 0x20);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e8);
    _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffe6),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e9);
    piVar4 = (int64_t *)((long)piVar4 + 1);
    iVar1 = record_receipt((st_quicly_pn_space_t *)send_ack_at,in_RDI,is_ack_only,lVar3 + 1,piVar4);
    _ok((int)(ulong)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1eb);
    _ok((int)(ulong)(piVar4 == (int64_t *)0x7fffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ec);
  }
  do_free_pn_space((st_quicly_pn_space_t *)0x159808);
  return;
}

Assistant:

static void do_test_record_receipt(size_t epoch)
{
    struct st_quicly_pn_space_t *space =
        alloc_pn_space(sizeof(*space), epoch == QUICLY_EPOCH_1RTT ? QUICLY_DEFAULT_PACKET_TOLERANCE : 1);
    uint64_t pn = 0;
    int64_t now = 12345, send_ack_at = INT64_MAX;

    if (epoch == QUICLY_EPOCH_1RTT) {
        /* 2nd packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    } else {
        /* every packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* ack-only packets do not elicit an ack */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    pn++; /* gap */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;

    /* gap triggers an ack */
    pn += 1; /* gap */
    ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
    ok(send_ack_at == now);
    now += 1;

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* if 1-RTT, test ignore-order */
    if (epoch == QUICLY_EPOCH_1RTT) {
        space->ignore_order = 1;
        pn++; /* gap */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    do_free_pn_space(space);
}